

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool LargeIntRegMultiply<long,_unsigned_long>::RegMultiply(int64_t *a,uint64_t *b,int64_t *pRet)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  int64_t iVar4;
  int64_t *in_RDX;
  long *in_RDI;
  int64_t a1;
  uint64_t tmp;
  bool aNegative;
  uint64_t *in_stack_ffffffffffffffa8;
  uint64_t *in_stack_ffffffffffffffb0;
  ulong uVar5;
  
  lVar1 = *in_RDI;
  if (lVar1 < 0) {
    AbsValueHelper<long,_1>::Abs(0x1b27e5);
  }
  bVar2 = LargeIntRegMultiply<unsigned_long,_unsigned_long>::RegMultiply
                    (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(uint64_t *)0x1b2815);
  if (bVar2) {
    if (lVar1 < 0) {
      uVar5 = 0;
      uVar3 = std::numeric_limits<long>::min();
      if (uVar5 <= uVar3) {
        iVar4 = SignedNegation<long>::Value(0);
        *in_RDX = iVar4;
        return true;
      }
    }
    else {
      uVar5 = 0;
      uVar3 = std::numeric_limits<long>::max();
      if (uVar5 <= uVar3) {
        *in_RDX = 0;
        return true;
      }
    }
  }
  return false;
}

Assistant:

static bool RegMultiply( const std::int64_t& a, const std::uint64_t& b, std::int64_t* pRet ) SAFEINT_NOTHROW
    {
        bool aNegative = false;

        std::uint64_t tmp = 0;
        std::int64_t a1 = a;

        if( a1 < 0 )
        {
            aNegative = true;
            a1 = (std::int64_t)AbsValueHelper< std::int64_t, GetAbsMethod< std::int64_t >::method >::Abs(a1);
        }

        if( LargeIntRegMultiply< std::uint64_t, std::uint64_t >::RegMultiply( (std::uint64_t)a1, (std::uint64_t)b, &tmp ) )
        {
            // The unsigned multiplication didn't overflow
            if( aNegative )
            {
                // Result must be negative
                if( tmp <= (std::uint64_t)std::numeric_limits< std::int64_t >::min() )
                {
                    *pRet = SignedNegation< std::int64_t >::Value( tmp );
                    return true;
                }
            }
            else
            {
                // Result must be positive
                if( tmp <= (std::uint64_t)std::numeric_limits<std::int64_t>::max() )
                {
                    *pRet = (std::int64_t)tmp;
                    return true;
                }
            }
        }

        return false;
    }